

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT.c
# Opt level: O1

uint32_t FACTCue_GetVariable(FACTCue *pCue,uint16_t nIndex,float *nValue)

{
  float fVar1;
  
  if (pCue == (FACTCue *)0x0) {
    *nValue = 0.0;
  }
  else if (nIndex != 0xffff) {
    FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);
    if (nIndex == 0) {
      fVar1 = (float)pCue->parentBank->cues[pCue->index].instanceCount;
    }
    else {
      fVar1 = pCue->variableValues[nIndex];
    }
    *nValue = fVar1;
    FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
    return 0;
  }
  return 1;
}

Assistant:

uint32_t FACTCue_GetVariable(
	FACTCue *pCue,
	uint16_t nIndex,
	float *nValue
) {
	FACTVariable *var;
	if (pCue == NULL)
	{
		*nValue = 0.0f;
		return 1;
	}

	if (nIndex == FACTINDEX_INVALID)
	{
		return 1;
	}

	FAudio_PlatformLockMutex(pCue->parentBank->parentEngine->apiLock);

	var = &pCue->parentBank->parentEngine->variables[nIndex];
	FAudio_assert(var->accessibility & 0x01);
	FAudio_assert(var->accessibility & 0x04);

	if (nIndex == 0) /* NumCueInstances */
	{
		*nValue = pCue->parentBank->cues[pCue->index].instanceCount;
	}
	else
	{
		*nValue = pCue->variableValues[nIndex];
	}

	FAudio_PlatformUnlockMutex(pCue->parentBank->parentEngine->apiLock);
	return 0;
}